

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_addiusp(DisasContext_conflict6 *ctx)

{
  uint local_18;
  int decoded;
  int encoded;
  DisasContext_conflict6 *ctx_local;
  
  local_18 = ctx->opcode >> 1 & 0x1ff;
  if (local_18 < 2) {
    local_18 = local_18 + 0x100;
  }
  else if (0xff < local_18) {
    if (local_18 < 0x1fe) {
      local_18 = local_18 - 0x200;
    }
    else {
      local_18 = local_18 - 0x300;
    }
  }
  gen_arith_imm(ctx,0x24000000,0x1d,0x1d,local_18 << 2);
  return;
}

Assistant:

static void gen_addiusp(DisasContext *ctx)
{
    int encoded = ZIMM(ctx->opcode, 1, 9);
    int decoded;

    if (encoded <= 1) {
        decoded = 256 + encoded;
    } else if (encoded <= 255) {
        decoded = encoded;
    } else if (encoded <= 509) {
        decoded = encoded - 512;
    } else {
        decoded = encoded - 768;
    }

    gen_arith_imm(ctx, OPC_ADDIU, 29, 29, decoded << 2);
}